

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::Matcher::MatchHere
          (Matcher *this,Char *input,CharCount inputLength,CharCount *matchStart,
          CharCount *nextSyncInputOffset,ContStack *contStack,AssertionStack *assertionStack,
          uint *qcTicks,bool firstIteration)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  ulong uVar5;
  
  (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
  super_ContinuousPageStack<1UL>.nextTop = 0;
  (assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>).
  super_ContinuousPageStack<1UL>.nextTop = 0;
  if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0x142a,"(contStack.IsEmpty())","contStack.IsEmpty()");
    if (!bVar2) {
LAB_00eec5b3:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    if ((assertionStack->super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>)
        .super_ContinuousPageStack<1UL>.nextTop != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x142b,"(assertionStack.IsEmpty())","assertionStack.IsEmpty()");
      if (!bVar2) goto LAB_00eec5b3;
      *puVar3 = 0;
    }
  }
  uVar4 = (ulong)((this->program).ptr)->numGroups;
  if (uVar4 != 0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar5 = 0;
    do {
      if (((this->program).ptr)->numGroups <= uVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                           ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                           "groupId >= 0 && groupId < program->numGroups");
        if (!bVar2) goto LAB_00eec5b3;
        *puVar3 = 0;
      }
      (this->groupInfos).ptr[uVar5].length = 0xffffffff;
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  ResetLoopInfos(this);
  Run(this,input,inputLength,matchStart,nextSyncInputOffset,contStack,assertionStack,qcTicks,
      firstIteration);
  return ((this->groupInfos).ptr)->length != 0xffffffff;
}

Assistant:

inline bool Matcher::MatchHere(const Char* const input, const CharCount inputLength, CharCount &matchStart, CharCount &nextSyncInputOffset, ContStack &contStack, AssertionStack &assertionStack, uint &qcTicks, bool firstIteration)
    {
        // Reset the continuation and assertion stacks ready for fresh run
        // NOTE: We used to do this after the Run, but it's safer to do it here in case unusual control flow exits
        //       the matcher without executing the clears.
        contStack.Clear();
        // assertionStack may be non-empty since we can hard fail directly out of matcher without popping assertion
        assertionStack.Clear();

        Assert(contStack.IsEmpty());
        Assert(assertionStack.IsEmpty());

        ResetInnerGroups(0, program->numGroups - 1);
#if DBG
        ResetLoopInfos();
#endif

        Run(input, inputLength, matchStart, nextSyncInputOffset, contStack, assertionStack, qcTicks, firstIteration);
        // Leave the continuation and assertion stack memory in place so we don't have to alloc next time

        return WasLastMatchSuccessful();
    }